

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O3

sljit_s32 sljit_emit_op2(sljit_compiler *compiler,sljit_s32 op,sljit_s32 dst,sljit_sw dstw,
                        sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  int iVar1;
  sljit_u8 *psVar2;
  undefined1 *puVar3;
  uint uVar4;
  uint uVar5;
  sljit_u32 sVar6;
  sljit_s32 sVar7;
  sljit_u8 mode;
  
  if (compiler->error != 0) {
    return compiler->error;
  }
  compiler->mode32 = op & 0x100;
  uVar4 = op & 0xfe00;
  sVar7 = 0;
  if (uVar4 == 0 && dst == 0) {
    return 0;
  }
  switch(op & 0xffff00ff) {
  case 0x60:
    if ((uVar4 == 0) &&
       (sVar7 = emit_lea_binary(compiler,dst,dstw,src1,src1w,src2,src2w), sVar7 != 4))
    goto LAB_00108a53;
    sVar6 = 0x5030100;
    break;
  case 0x61:
    sVar6 = 0x15131110;
    break;
  case 0x62:
    if (((src2 & 0x40U) != 0 && uVar4 == 0) &&
       (sVar7 = emit_lea_binary(compiler,dst,dstw,src1,src1w,0x40,-src2w), sVar7 != 4))
    goto LAB_00108a53;
    if (dst == 0) {
      sVar7 = emit_cmp_binary(compiler,src1,src1w,src2,src2w);
      return sVar7;
    }
    sVar6 = 0x2d2b2928;
    goto LAB_001086db;
  case 99:
    sVar6 = 0x1d1b1918;
LAB_001086db:
    sVar7 = emit_non_cum_binary(compiler,sVar6,dst,dstw,src1,src1w,src2,src2w);
    return sVar7;
  case 100:
    uVar4 = 0xf;
    if (dst - 1U < 0x3f) {
      uVar4 = dst;
    }
    if ((src2 & 0x40U) == 0 && uVar4 == src1) {
      psVar2 = emit_x86_instruction(compiler,2,src1,0,src2,src2w);
      if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
      psVar2[0] = '\x0f';
      psVar2[1] = 0xaf;
    }
    else {
      uVar5 = src2;
      if ((src1 & 0x40U) == 0 && uVar4 == src2) {
LAB_001088b6:
        psVar2 = emit_x86_instruction(compiler,2,uVar5,0,src1,src1w);
        if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
        psVar2[0] = '\x0f';
        psVar2[1] = 0xaf;
      }
      else {
        uVar5 = uVar4;
        if ((src1 & 0x40U) == 0) {
          if ((src2 & 0x40U) == 0) {
            if (((char)src2 < '\0') &&
               (((src2 & 0x3fU) == uVar4 || (((uint)src2 >> 8 & 0x3f) == uVar4)))) {
              uVar5 = 0xf;
            }
            sVar7 = emit_mov(compiler,uVar5,0,src1,src1w);
            src1w = src2w;
            src1 = src2;
            if (sVar7 != 0) goto LAB_00108a53;
            goto LAB_001088b6;
          }
          if ((char)src2w == src2w) {
            psVar2 = emit_x86_instruction(compiler,1,uVar4,0,src1,src1w);
            if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
            *psVar2 = 'k';
            puVar3 = (undefined1 *)ensure_buf(compiler,2);
            if (puVar3 == (undefined1 *)0x0) goto LAB_00108a53;
            *puVar3 = 1;
            compiler->size = compiler->size + 1;
            puVar3[1] = (char)src2w;
          }
          else {
            if ((int)src2w != src2w) {
              if ((uVar4 != src1) && (sVar7 = emit_mov(compiler,uVar4,0,src1,src1w), sVar7 != 0))
              goto LAB_00108a53;
              iVar1 = emit_load_imm64(compiler,0x10,src2w);
              goto joined_r0x001087fe;
            }
            psVar2 = emit_x86_instruction(compiler,1,uVar4,0,src1,src1w);
            if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
            *psVar2 = 'i';
            puVar3 = (undefined1 *)ensure_buf(compiler,5);
            if (puVar3 == (undefined1 *)0x0) goto LAB_00108a53;
            *puVar3 = 4;
            compiler->size = compiler->size + 4;
            *(int *)(puVar3 + 1) = (int)src2w;
          }
        }
        else {
          if ((src2 & 0x40U) != 0) {
            sVar7 = emit_mov(compiler,uVar4,0,0x40,src2w);
            src2w = 0;
            src2 = uVar4;
            if (sVar7 != 0) goto LAB_00108a53;
          }
          if ((char)src1w == src1w) {
            psVar2 = emit_x86_instruction(compiler,1,uVar4,0,src2,src2w);
            if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
            *psVar2 = 'k';
            puVar3 = (undefined1 *)ensure_buf(compiler,2);
            if (puVar3 == (undefined1 *)0x0) goto LAB_00108a53;
            *puVar3 = 1;
            compiler->size = compiler->size + 1;
            puVar3[1] = (char)src1w;
          }
          else {
            if ((int)src1w != src1w) {
              if ((uVar4 != src2) && (sVar7 = emit_mov(compiler,uVar4,0,src2,src2w), sVar7 != 0))
              goto LAB_00108a53;
              iVar1 = emit_load_imm64(compiler,0x10,src1w);
joined_r0x001087fe:
              if (iVar1 != 0) goto LAB_00108a53;
              src1 = 0x10;
              src1w = 0;
              goto LAB_001088b6;
            }
            psVar2 = emit_x86_instruction(compiler,1,uVar4,0,src2,src2w);
            if (psVar2 == (sljit_u8 *)0x0) goto LAB_00108a53;
            *psVar2 = 'i';
            puVar3 = (undefined1 *)ensure_buf(compiler,5);
            if (puVar3 == (undefined1 *)0x0) goto LAB_00108a53;
            *puVar3 = 4;
            compiler->size = compiler->size + 4;
            *(int *)(puVar3 + 1) = (int)src1w;
          }
        }
      }
    }
    if (-1 < (char)dst) {
      return 0;
    }
    psVar2 = emit_x86_instruction(compiler,1,0xf,0,dst,dstw);
    if (psVar2 != (sljit_u8 *)0x0) {
      *psVar2 = 0x89;
      return 0;
    }
LAB_00108a53:
    return compiler->error;
  case 0x65:
    if (dst == 0) {
      sVar7 = emit_test_binary(compiler,src1,src1w,src2,src2w);
      return sVar7;
    }
    sVar6 = 0x25232120;
    break;
  case 0x66:
    sVar6 = 0xd0b0908;
    break;
  case 0x67:
    sVar7 = emit_cum_binary(compiler,0x35333130,dst,dstw,src1,src1w,src2,src2w);
    return sVar7;
  case 0x68:
    mode = ' ';
    goto LAB_00108768;
  case 0x69:
    mode = '(';
    goto LAB_00108768;
  case 0x6a:
    mode = '8';
LAB_00108768:
    sVar7 = emit_shift_with_flags(compiler,mode,uVar4,dst,dstw,src1,src1w,src2,src2w);
  default:
    goto switchD_00108577_default;
  }
  sVar7 = emit_cum_binary(compiler,sVar6,dst,dstw,src1,src1w,src2,src2w);
switchD_00108577_default:
  return sVar7;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_op2(struct sljit_compiler *compiler, sljit_s32 op,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_op2(compiler, op, dst, dstw, src1, src1w, src2, src2w));
	ADJUST_LOCAL_OFFSET(dst, dstw);
	ADJUST_LOCAL_OFFSET(src1, src1w);
	ADJUST_LOCAL_OFFSET(src2, src2w);

	CHECK_EXTRA_REGS(dst, dstw, (void)0);
	CHECK_EXTRA_REGS(src1, src1w, (void)0);
	CHECK_EXTRA_REGS(src2, src2w, (void)0);
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = op & SLJIT_I32_OP;
#endif

	if (dst == SLJIT_UNUSED && !HAS_FLAGS(op))
		return SLJIT_SUCCESS;

	switch (GET_OPCODE(op)) {
	case SLJIT_ADD:
		if (!HAS_FLAGS(op)) {
			if (emit_lea_binary(compiler, dst, dstw, src1, src1w, src2, src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}
		return emit_cum_binary(compiler, BINARY_OPCODE(ADD),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ADDC:
		return emit_cum_binary(compiler, BINARY_OPCODE(ADC),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUB:
		if (!HAS_FLAGS(op)) {
			if ((src2 & SLJIT_IMM) && emit_lea_binary(compiler, dst, dstw, src1, src1w, SLJIT_IMM, -src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}

		if (dst == SLJIT_UNUSED)
			return emit_cmp_binary(compiler, src1, src1w, src2, src2w);
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUBC:
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SBB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_MUL:
		return emit_mul(compiler, dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_AND:
		if (dst == SLJIT_UNUSED)
			return emit_test_binary(compiler, src1, src1w, src2, src2w);
		return emit_cum_binary(compiler, BINARY_OPCODE(AND),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_OR:
		return emit_cum_binary(compiler, BINARY_OPCODE(OR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_XOR:
		return emit_cum_binary(compiler, BINARY_OPCODE(XOR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SHL:
		return emit_shift_with_flags(compiler, SHL, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_LSHR:
		return emit_shift_with_flags(compiler, SHR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ASHR:
		return emit_shift_with_flags(compiler, SAR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	}

	return SLJIT_SUCCESS;
}